

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSyncTests.cpp
# Opt level: O3

int __thiscall deqp::egl::anon_unknown_0::SyncTest::init(SyncTest *this,EVP_PKEY_CTX *ctx)

{
  Extension EVar1;
  NativeDisplay *pNVar2;
  SyncTest *pSVar3;
  int iVar4;
  deUint32 dVar5;
  Extension EVar6;
  GLenum err;
  Library *pLVar7;
  NativeWindowFactory *pNVar8;
  EGLDisplay pvVar9;
  EGLConfig pvVar10;
  undefined4 extraout_var;
  istream *piVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  EGLSurface pvVar12;
  GLubyte *__s;
  NotSupportedError *pNVar13;
  uint uVar14;
  uint uVar15;
  bool bVar16;
  EGLint contextAttribList [3];
  EGLint displayAttribList [7];
  istringstream extensionStream;
  allocator<char> local_229;
  undefined1 *local_228;
  undefined8 local_220;
  undefined1 local_218;
  undefined7 uStack_217;
  SyncTest *local_208;
  Extension local_1fc;
  NativeWindowFactory *local_1f8;
  Library *local_1f0;
  undefined8 local_1e8;
  undefined4 local_1e0;
  EGLint local_1d8 [10];
  undefined8 local_1b0;
  Visibility local_1a8;
  ios_base local_138 [264];
  
  pLVar7 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pNVar8 = eglu::selectNativeWindowFactory
                     (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplayFactory,
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  local_1d8[4] = 0x3021;
  local_1d8[5] = 1;
  local_1d8[6] = 0x3038;
  local_1d8[0] = 0x3040;
  local_1d8[1] = 4;
  local_1d8[2] = 0x3033;
  local_1d8[3] = 4;
  local_1e8 = 0x200003098;
  local_1e0 = 0x3038;
  pvVar9 = eglu::getAndInitDisplay
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(Version *)0x0);
  this->m_eglDisplay = pvVar9;
  pvVar10 = eglu::chooseSingleConfig(pLVar7,pvVar9,local_1d8);
  this->m_eglConfig = pvVar10;
  EglTestContext::initGLFunctions((this->super_TestCase).m_eglTestCtx,&this->m_gl,(ApiType)0x2);
  EVar6 = (uint)(this->m_syncType == 0x30fa) << 2;
  if (this->m_syncType == 0x30f9) {
    EVar6 = EXTENSION_FENCE_SYNC;
  }
  EVar1 = this->m_extensions;
  iVar4 = (*pLVar7->_vptr_Library[0x2a])(pLVar7,this->m_eglDisplay,0x3055);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,(char *)CONCAT44(extraout_var,iVar4),&local_229);
  std::__cxx11::istringstream::istringstream((istringstream *)&local_1b0,(string *)&local_228,_S_in)
  ;
  if (local_228 != &local_218) {
    operator_delete(local_228,CONCAT71(uStack_217,local_218) + 1);
  }
  local_220 = 0;
  local_218 = 0;
  local_228 = &local_218;
  local_208 = this;
  local_1fc = EVar6 | EVar1;
  local_1f8 = pNVar8;
  local_1f0 = pLVar7;
  dVar5 = (*pLVar7->_vptr_Library[0x1f])(pLVar7);
  eglu::checkError(dVar5,"eglQueryString(display, EGL_EXTENSIONS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                   ,0x81);
  uVar15 = 0;
  while( true ) {
    piVar11 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&local_1b0,(string *)&local_228,' ');
    pSVar3 = local_208;
    if (((byte)piVar11[*(long *)(*(long *)piVar11 + -0x18) + 0x20] & 5) != 0) break;
    iVar4 = std::__cxx11::string::compare((char *)&local_228);
    if (iVar4 == 0) {
      uVar14 = 2;
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)&local_228);
      if (iVar4 == 0) {
        uVar14 = 4;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&local_228);
        uVar14 = (uint)(iVar4 == 0);
      }
    }
    uVar15 = uVar15 | uVar14;
  }
  EVar6 = local_1fc & ~uVar15;
  if ((EVar6 & EXTENSION_FENCE_SYNC) == EXTENSION_NONE) {
    if ((EVar6 & EXTENSION_REUSABLE_SYNC) == EXTENSION_NONE) {
      if ((EVar6 & EXTENSION_WAIT_SYNC) == EXTENSION_NONE) {
        if (local_228 != &local_218) {
          operator_delete(local_228,CONCAT71(uStack_217,local_218) + 1);
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)&local_1b0);
        iVar4 = std::ios_base::~ios_base(local_138);
        pLVar7 = local_1f0;
        if (pSVar3->m_useCurrentContext == true) {
          (**local_1f0->_vptr_Library)(local_1f0,0x30a0);
          dVar5 = (*pLVar7->_vptr_Library[0x1f])(pLVar7);
          eglu::checkError(dVar5,"bindAPI(EGL_OPENGL_ES_API)",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                           ,0xd9);
          iVar4 = (*pLVar7->_vptr_Library[6])(pLVar7,pSVar3->m_eglDisplay,pSVar3->m_eglConfig,0);
          pSVar3->m_eglContext = (EGLContext)CONCAT44(extraout_var_00,iVar4);
          dVar5 = (*pLVar7->_vptr_Library[0x1f])(pLVar7);
          eglu::checkError(dVar5,"Failed to create GLES2 context",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                           ,0xdb);
          pNVar2 = (((pSVar3->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                   super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.
                   m_data.ptr;
          pvVar9 = local_208->m_eglDisplay;
          pvVar10 = local_208->m_eglConfig;
          local_1a8 = eglu::parseWindowVisibility
                                (((local_208->super_TestCase).super_TestCase.super_TestNode.
                                 m_testCtx)->m_cmdLine);
          pSVar3 = local_208;
          local_1b0 = 0x1e0000001e0;
          iVar4 = (*(local_1f8->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                            (local_1f8,pNVar2,pvVar9,pvVar10);
          pSVar3->m_nativeWindow = (NativeWindow *)CONCAT44(extraout_var_01,iVar4);
          pvVar12 = eglu::createWindowSurface
                              ((((pSVar3->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                               super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                               .m_data.ptr,(NativeWindow *)CONCAT44(extraout_var_01,iVar4),
                               pSVar3->m_eglDisplay,pSVar3->m_eglConfig,(EGLAttrib *)0x0);
          pSVar3->m_eglSurface = pvVar12;
          (*pLVar7->_vptr_Library[0x27])
                    (pLVar7,pSVar3->m_eglDisplay,pvVar12,pvVar12,pSVar3->m_eglContext);
          dVar5 = (*pLVar7->_vptr_Library[0x1f])(pLVar7);
          eglu::checkError(dVar5,
                           "makeCurrent(m_eglDisplay, m_eglSurface, m_eglSurface, m_eglContext)",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                           ,0xe1);
          __s = (*(pSVar3->m_gl).getString)(0x1f03);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_228,(char *)__s,&local_229);
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)&local_1b0,(string *)&local_228,_S_in);
          if (local_228 != &local_218) {
            operator_delete(local_228,CONCAT71(uStack_217,local_218) + 1);
          }
          local_220 = 0;
          local_218 = 0;
          local_228 = &local_218;
          err = (*(pSVar3->m_gl).getError)();
          glu::checkError(err,"glGetString(GL_EXTENSIONS)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                          ,0xa1);
          bVar16 = false;
          while( true ) {
            piVar11 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)&local_1b0,(string *)&local_228,' ');
            if (((byte)piVar11[*(long *)(*(long *)piVar11 + -0x18) + 0x20] & 5) != 0) break;
            iVar4 = std::__cxx11::string::compare((char *)&local_228);
            bVar16 = (bool)(bVar16 | iVar4 == 0);
          }
          if (!bVar16) {
            pNVar13 = (NotSupportedError *)__cxa_allocate_exception(0x38);
            tcu::NotSupportedError::NotSupportedError
                      (pNVar13,"GL_OES_EGL_sync not supported",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                       ,0xaa);
            __cxa_throw(pNVar13,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
          }
          if (local_228 != &local_218) {
            operator_delete(local_228,CONCAT71(uStack_217,local_218) + 1);
          }
          std::__cxx11::istringstream::~istringstream((istringstream *)&local_1b0);
          iVar4 = std::ios_base::~ios_base(local_138);
        }
        return iVar4;
      }
      pNVar13 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar13,"EGL_KHR_wait_sync not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                 ,0x97);
    }
    else {
      pNVar13 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar13,"EGL_KHR_reusable_sync not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                 ,0x94);
    }
  }
  else {
    pNVar13 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar13,"EGL_KHR_fence_sync not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
               ,0x91);
  }
  __cxa_throw(pNVar13,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SyncTest::init (void)
{
	const Library&						egl				= m_eglTestCtx.getLibrary();
	const eglu::NativeWindowFactory&	windowFactory	= eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

	const EGLint displayAttribList[] =
	{
		EGL_RENDERABLE_TYPE,	EGL_OPENGL_ES2_BIT,
		EGL_SURFACE_TYPE,		EGL_WINDOW_BIT,
		EGL_ALPHA_SIZE,			1,
		EGL_NONE
	};

	const EGLint contextAttribList[] =
	{
		EGL_CONTEXT_CLIENT_VERSION, 2,
		EGL_NONE
	};

	m_eglDisplay	= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	m_eglConfig		= eglu::chooseSingleConfig(egl, m_eglDisplay, displayAttribList);

	m_eglTestCtx.initGLFunctions(&m_gl, glu::ApiType::es(2,0));

	{
		const Extension syncTypeExtension = getSyncTypeExtension(m_syncType);
		requiredEGLExtensions(egl, m_eglDisplay, (Extension)(m_extensions | syncTypeExtension));
	}

	if (m_useCurrentContext)
	{
		// Create context
		EGLU_CHECK_CALL(egl, bindAPI(EGL_OPENGL_ES_API));
		m_eglContext = egl.createContext(m_eglDisplay, m_eglConfig, EGL_NO_CONTEXT, contextAttribList);
		EGLU_CHECK_MSG(egl, "Failed to create GLES2 context");

		// Create surface
		m_nativeWindow = windowFactory.createWindow(&m_eglTestCtx.getNativeDisplay(), m_eglDisplay, m_eglConfig, DE_NULL, eglu::WindowParams(480, 480, eglu::parseWindowVisibility(m_testCtx.getCommandLine())));
		m_eglSurface = eglu::createWindowSurface(m_eglTestCtx.getNativeDisplay(), *m_nativeWindow, m_eglDisplay, m_eglConfig, DE_NULL);

		EGLU_CHECK_CALL(egl, makeCurrent(m_eglDisplay, m_eglSurface, m_eglSurface, m_eglContext));

		requiredGLESExtensions(m_gl);
	}
}